

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_16_bit_from_memory(stbi_uc *buffer,int len)

{
  int iVar1;
  int in_ESI;
  stbi_uc *in_RDI;
  stbi__context s;
  stbi__context *in_stack_ffffffffffffff08;
  stbi__context local_f0;
  
  stbi__start_mem(&local_f0,in_RDI,in_ESI);
  iVar1 = stbi__is_16_main(in_stack_ffffffffffffff08);
  return iVar1;
}

Assistant:

STBIDEF int stbi_is_16_bit_from_memory(stbi_uc const *buffer, int len)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__is_16_main(&s);
}